

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

void anm_free(anm_archive_t *anm)

{
  list_node_t *__ptr;
  void *__ptr_00;
  bool bVar1;
  list_node_t *local_78;
  list_node_t *node_5;
  sprite19_t *sprite;
  list_node_t *node_4;
  anm_instr_t *instr_1;
  list_node_t *node_3;
  thanm_instr_t *instr;
  list_node_t *node_2;
  anm_script_t *script;
  list_node_t *node_1;
  anm_entry_t *entry;
  list_node_t *node;
  char *name;
  int is_mapped;
  anm_archive_t *anm_local;
  
  bVar1 = anm->map != (uchar *)0x0;
  for (entry = (anm_entry_t *)(anm->names).head; entry != (anm_entry_t *)0x0;
      entry = (anm_entry_t *)entry->header) {
    free(entry->name);
  }
  list_free_nodes(&anm->names);
  for (script = (anm_script_t *)(anm->entries).head; script != (anm_script_t *)0x0;
      script = *(anm_script_t **)script) {
    __ptr = (script->instrs).head;
    for (instr = (thanm_instr_t *)__ptr[3].next; instr != (thanm_instr_t *)0x0;
        instr = *(thanm_instr_t **)instr) {
      __ptr_00 = *(void **)&instr->address;
      if (!bVar1) {
        free(*(void **)((long)__ptr_00 + 8));
      }
      for (instr_1 = *(anm_instr_t **)((long)__ptr_00 + 0x10); instr_1 != (anm_instr_t *)0x0;
          instr_1 = *(anm_instr_t **)instr_1) {
        thanm_instr_free((thanm_instr_t *)instr_1[2]);
      }
      if ((!bVar1) || (*(int *)&__ptr->next[1].data == 0)) {
        for (sprite = *(sprite19_t **)((long)__ptr_00 + 0x20); sprite != (sprite19_t *)0x0;
            sprite = *(sprite19_t **)sprite) {
          free(*(void **)&sprite->h);
        }
      }
      list_free_nodes((list_t *)((long)__ptr_00 + 0x10));
      list_free_nodes((list_t *)((long)__ptr_00 + 0x20));
      free(__ptr_00);
    }
    list_free_nodes((list_t *)(__ptr + 3));
    if (bVar1) {
      if (6 < *(uint *)&__ptr->next[1].data) {
        free(__ptr->next);
      }
    }
    else {
      free(__ptr->next);
      free(__ptr->prev);
      free(__ptr[1].next);
      free(__ptr[3].data);
      for (local_78 = __ptr[2].prev; local_78 != (list_node_t *)0x0; local_78 = local_78->next) {
        free(local_78->data);
      }
    }
    list_free_nodes((list_t *)&__ptr[2].prev);
    free(__ptr[1].prev);
    free(__ptr);
  }
  list_free_nodes(&anm->entries);
  if (bVar1) {
    file_munmap(anm->map,anm->map_size);
  }
  free(anm);
  return;
}

Assistant:

static void
anm_free(
    anm_archive_t* anm)
{
    int is_mapped = anm->map != NULL;

    char* name;
    list_for_each(&anm->names, name)
        free(name);
    list_free_nodes(&anm->names);

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        anm_script_t* script;
        list_for_each(&entry->scripts, script) {
            if (!is_mapped)
                free(script->offset);

            thanm_instr_t* instr;
            list_for_each(&script->instrs, instr) {
                thanm_instr_free(instr);
            }
            if (!is_mapped || entry->header->version == 0) {
                anm_instr_t* instr;
                list_for_each(&script->raw_instrs, instr) {
                    free(instr);
                }
            }
            list_free_nodes(&script->instrs);
            list_free_nodes(&script->raw_instrs);

            free(script);
        }
        list_free_nodes(&entry->scripts);

        if (!is_mapped) {
            free(entry->header);
            free(entry->thtx);
            free(entry->name2);
            free(entry->data);

            sprite19_t* sprite;
            list_for_each(&entry->sprites, sprite)
                free(sprite);
        } else if (entry->header->version >= 7) {
            free(entry->header);
        }
        list_free_nodes(&entry->sprites);

        free(entry->filename);
        free(entry);
    }
    list_free_nodes(&anm->entries);

    if (is_mapped)
        file_munmap(anm->map, anm->map_size);

    free(anm);
}